

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

Table * __thiscall wabt::Module::GetTable(Module *this,Var *var)

{
  Table *pTVar1;
  Var *var_local;
  Module *this_local;
  
  pTVar1 = GetTable(this,var);
  return pTVar1;
}

Assistant:

const Table* Module::GetTable(const Var& var) const {
  return const_cast<Module*>(this)->GetTable(var);
}